

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# viplanner.cpp
# Opt level: O0

int __thiscall
VIPlanner::replan(VIPlanner *this,double allocatedtime,
                 vector<int,_std::allocator<int>_> *solution_stateIDs_V)

{
  clock_t cVar1;
  clock_t cVar2;
  long *in_RDI;
  double in_XMM0_Qa;
  clock_t starttime;
  FILE *fStat;
  FILE *fPolicy;
  char *stat;
  char *policy;
  
  (**(code **)(*in_RDI + 0xf8))();
  cVar1 = clock();
  while (cVar2 = clock(), (double)(cVar2 - cVar1) / 1000000.0 < in_XMM0_Qa && 0.01 < g_belldelta) {
    *(int *)(in_RDI + 8) = (int)in_RDI[8] + 1;
    g_belldelta = 0.0;
    (**(code **)(*in_RDI + 0xf0))();
    if ((int)in_RDI[8] % 100 == 0) {
      (**(code **)(*in_RDI + 0xd0))(in_RDI,_stdout,cVar1);
      (**(code **)(*in_RDI + 0xd0))(in_RDI,1,cVar1);
    }
  }
  cVar2 = clock();
  g_runtime = cVar2 - cVar1;
  (**(code **)(*in_RDI + 0xd0))(in_RDI,_stdout,cVar1);
  (**(code **)(*in_RDI + 0xd0))(in_RDI,1,cVar1);
  (**(code **)(*in_RDI + 0xd8))(in_RDI,1);
  return 1;
}

Assistant:

int VIPlanner::replan(double allocatedtime, vector<int>* solution_stateIDs_V)
{
#ifndef ROS
    const char* policy = "policy.txt";
    const char* stat = "stat.txt";
#endif
    FILE* fPolicy = SBPL_FOPEN(policy, "w");
    FILE* fStat = SBPL_FOPEN(stat, "w");

    //initialization
    InitializePlanner();

    //start the timer
    clock_t starttime = clock();

    //--------------iterate-------------------------------
    while (((clock() - starttime) / (double)CLOCKS_PER_SEC) < allocatedtime && g_belldelta > MDP_ERRDELTA) {
        viPlanner.iteration++;

        g_belldelta = 0;
        perform_iteration_forward();

        if (viPlanner.iteration % 100 == 0) {
            PrintStat(stdout, starttime);
            PrintStat(fStat, starttime);
        }
    }
    //------------------------------------------------------------------

    g_runtime = clock() - starttime;

    PrintStat(stdout, starttime);
    PrintStat(fStat, starttime);
    SBPL_FFLUSH(fStat);

    PrintPolicy(fPolicy);

    SBPL_FCLOSE(fPolicy);
    SBPL_FCLOSE(fStat);

    return 1;
}